

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_store_fcr(DisasContext_conflict2 *s,TCGv_i32 val,int reg)

{
  TCGContext_conflict2 *tcg_ctx_00;
  TCGContext_conflict2 *tcg_ctx;
  int reg_local;
  TCGv_i32 val_local;
  DisasContext_conflict2 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  if (reg != 1) {
    if (reg == 2) {
      tcg_gen_st_i32(tcg_ctx_00,val,tcg_ctx_00->cpu_env,0x104);
    }
    else if (reg == 4) {
      gen_helper_set_fpcr(tcg_ctx_00,tcg_ctx_00->cpu_env,val);
    }
  }
  return;
}

Assistant:

static void gen_store_fcr(DisasContext *s, TCGv val, int reg)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    switch (reg) {
    case M68K_FPIAR:
        break;
    case M68K_FPSR:
        tcg_gen_st_i32(tcg_ctx, val, tcg_ctx->cpu_env, offsetof(CPUM68KState, fpsr));
        break;
    case M68K_FPCR:
        gen_helper_set_fpcr(tcg_ctx, tcg_ctx->cpu_env, val);
        break;
    }
}